

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_1)

{
  AssertionStats *param_1_local;
  AssertionStats *this_local;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_0027b160;
  AssertionResult::AssertionResult(&this->assertionResult,&param_1->assertionResult);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,&param_1->infoMessages);
  memcpy(&this->totals,&param_1->totals,0x38);
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;